

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_util.h
# Opt level: O2

int compute_sampled_height(int height,int y_sampling,int start_y)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (1 < y_sampling) {
    iVar3 = start_y % y_sampling;
    if (height == 1) {
      height = (int)(iVar3 == 0);
    }
    else {
      iVar4 = y_sampling - iVar3;
      if (iVar3 == 0) {
        iVar4 = 0;
      }
      uVar2 = (start_y + height) - 1;
      uVar1 = 1 - (start_y + height);
      if (0 < start_y + height) {
        uVar1 = uVar2;
      }
      height = 0;
      iVar3 = uVar2 - uVar1 % (uint)y_sampling;
      if (iVar4 + start_y <= iVar3) {
        height = (iVar3 - (iVar4 + start_y)) / y_sampling + 1;
      }
    }
  }
  return height;
}

Assistant:

static inline int
compute_sampled_height (int height, int y_sampling, int start_y)
{
    int nlines;

    if (y_sampling <= 1) return height;

    if (height == 1)
        nlines = (start_y % y_sampling) == 0 ? 1 : 0;
    else
    {
        int start, end;

        /* computed the number of times y % ysampling == 0, by
         * computing interval based on first and last time that occurs
         * on the given range
         */
        start = start_y % y_sampling;
        if (start != 0)
            start = start_y + (y_sampling - start);
        else
            start = start_y;
        end = start_y + height - 1;
        end -= (end < 0) ? (-end % y_sampling) : (end % y_sampling);

        if (start > end)
            nlines = 0;
        else
            nlines = (end - start) / y_sampling + 1;
    }

    return nlines;
}